

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fBlendTests.cpp
# Opt level: O3

int __thiscall deqp::gles2::Functional::BlendCase::init(BlendCase *this,EVP_PKEY_CTX *ctx)

{
  float *pfVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  int iVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  int iVar8;
  int extraout_EAX;
  RenderTarget *pRVar9;
  undefined8 uVar10;
  QuadRenderer *this_00;
  ReferenceQuadRenderer *this_01;
  TextureLevel *this_02;
  long lVar11;
  Context *this_03;
  TextureFormat local_20;
  
  this_03 = (this->super_TestCase).m_context;
  pRVar9 = Context::getRenderTarget(this_03);
  iVar4 = (pRVar9->m_pixelFormat).alphaBits;
  if (init()::baseGradientColors == '\0') {
    init((EVP_PKEY_CTX *)this_03);
  }
  lVar11 = 0;
  do {
    fVar5 = *(float *)((long)init::baseGradientColors[0].m_data + lVar11 + 4);
    fVar6 = *(float *)((long)init::baseGradientColors[0].m_data + lVar11 + 8);
    fVar7 = *(float *)((long)init::baseGradientColors[0].m_data + lVar11 + 0xc);
    pfVar1 = (float *)((long)(this->m_firstQuad).color[0].m_data + lVar11);
    *pfVar1 = (*(float *)((long)init::baseGradientColors[0].m_data + lVar11) + -0.5) * 0.2 + 0.5;
    pfVar1[1] = (fVar5 + -0.5) * 0.2 + 0.5;
    pfVar1[2] = (fVar6 + -0.5) * 0.2 + 0.5;
    pfVar1[3] = (fVar7 + -0.5) * 0.2 + 0.5;
    puVar2 = (undefined8 *)((long)(this->m_firstQuad).color[0].m_data + lVar11);
    uVar10 = puVar2[1];
    puVar3 = (undefined8 *)((long)(this->m_firstQuadInt).color[0].m_data + lVar11);
    *puVar3 = *puVar2;
    puVar3[1] = uVar10;
    fVar5 = *(float *)((long)init::baseGradientColors[0].m_data + lVar11 + 4);
    fVar6 = *(float *)((long)init::baseGradientColors[0].m_data + lVar11 + 8);
    fVar7 = *(float *)((long)init::baseGradientColors[0].m_data + lVar11 + 0xc);
    pfVar1 = (float *)((long)(this->m_secondQuad).color[0].m_data + lVar11);
    *pfVar1 = (1.0 - *(float *)((long)init::baseGradientColors[0].m_data + lVar11)) + -0.5 + 0.5;
    pfVar1[1] = (1.0 - fVar5) + -0.5 + 0.5;
    pfVar1[2] = (1.0 - fVar6) + -0.5 + 0.5;
    pfVar1[3] = (1.0 - fVar7) + -0.5 + 0.5;
    puVar2 = (undefined8 *)((long)(this->m_secondQuad).color[0].m_data + lVar11);
    uVar10 = puVar2[1];
    puVar3 = (undefined8 *)((long)(this->m_secondQuadInt).color[0].m_data + lVar11);
    *puVar3 = *puVar2;
    puVar3[1] = uVar10;
    lVar11 = lVar11 + 0x10;
  } while (lVar11 != 0x40);
  pRVar9 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar8 = pRVar9->m_width;
  if (0x3f < iVar8) {
    iVar8 = 0x40;
  }
  this->m_viewportW = iVar8;
  pRVar9 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar8 = 0x40;
  if (pRVar9->m_height < 0x40) {
    iVar8 = pRVar9->m_height;
  }
  this->m_viewportH = iVar8;
  *(undefined8 *)(this->m_firstQuadInt).posA.m_data = 0;
  *(undefined8 *)(this->m_secondQuadInt).posA.m_data = 0;
  uVar10 = CONCAT44(iVar8 + -1,this->m_viewportW + -1);
  *(undefined8 *)(this->m_firstQuadInt).posB.m_data = uVar10;
  *(undefined8 *)(this->m_secondQuadInt).posB.m_data = uVar10;
  this_00 = (QuadRenderer *)operator_new(0x20);
  deqp::gls::FragmentOpUtil::QuadRenderer::QuadRenderer
            (this_00,((this->super_TestCase).m_context)->m_renderCtx,GLSL_VERSION_100_ES);
  this->m_renderer = this_00;
  this_01 = (ReferenceQuadRenderer *)operator_new(0x11108);
  deqp::gls::FragmentOpUtil::ReferenceQuadRenderer::ReferenceQuadRenderer(this_01);
  this->m_referenceRenderer = this_01;
  this_02 = (TextureLevel *)operator_new(0x28);
  local_20.order = RGBA - (iVar4 == 0);
  local_20.type = UNORM_INT8;
  tcu::TextureLevel::TextureLevel(this_02,&local_20,this->m_viewportW,this->m_viewportH,1);
  this->m_refColorBuffer = this_02;
  this->m_curParamSetNdx = 0;
  return extraout_EAX;
}

Assistant:

void BlendCase::init (void)
{
	bool useRGB = m_context.getRenderTarget().getPixelFormat().alphaBits == 0;

	static const Vec4 baseGradientColors[4] =
	{
		Vec4(0.0f, 0.5f, 1.0f, 0.5f),
		Vec4(0.5f, 0.0f, 0.5f, 1.0f),
		Vec4(0.5f, 1.0f, 0.5f, 0.0f),
		Vec4(1.0f, 0.5f, 0.0f, 0.5f)
	};

	DE_STATIC_ASSERT(DE_LENGTH_OF_ARRAY(m_firstQuad.color) == DE_LENGTH_OF_ARRAY(m_firstQuadInt.color));
	for (int i = 0; i < DE_LENGTH_OF_ARRAY(m_firstQuad.color); i++)
	{
		m_firstQuad.color[i]		= (baseGradientColors[i] - 0.5f) * 0.2f + 0.5f;
		m_firstQuadInt.color[i]		= m_firstQuad.color[i];

		m_secondQuad.color[i]		= (Vec4(1.0f) - baseGradientColors[i] - 0.5f) * 1.0f + 0.5f;
		m_secondQuadInt.color[i]	= m_secondQuad.color[i];
	}

	m_viewportW = de::min<int>(m_context.getRenderTarget().getWidth(),	MAX_VIEWPORT_WIDTH);
	m_viewportH = de::min<int>(m_context.getRenderTarget().getHeight(),	MAX_VIEWPORT_HEIGHT);

	m_firstQuadInt.posA		= tcu::IVec2(0,					0);
	m_secondQuadInt.posA	= tcu::IVec2(0,					0);
	m_firstQuadInt.posB		= tcu::IVec2(m_viewportW-1,		m_viewportH-1);
	m_secondQuadInt.posB	= tcu::IVec2(m_viewportW-1,		m_viewportH-1);

	DE_ASSERT(!m_renderer);
	DE_ASSERT(!m_referenceRenderer);
	DE_ASSERT(!m_refColorBuffer);

	m_renderer				= new QuadRenderer(m_context.getRenderContext(), glu::GLSL_VERSION_100_ES);
	m_referenceRenderer		= new ReferenceQuadRenderer;
	m_refColorBuffer		= new TextureLevel(TextureFormat(useRGB ? TextureFormat::RGB : TextureFormat::RGBA, TextureFormat::UNORM_INT8),
											   m_viewportW, m_viewportH);

	m_curParamSetNdx = 0;
}